

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::showMinimized(QWidget *this)

{
  long lVar1;
  bool bVar2;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *unaff_retaddr;
  QWidget *in_stack_00000008;
  bool isMin;
  WindowStates in_stack_00000024;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isMinimized(in_RDI);
  uVar3 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffe4);
  if ((!bVar2) || (bVar2 = isVisible((QWidget *)0x367f7f), !bVar2)) {
    ensurePolished(in_stack_00000008);
    if ((uVar3 & 0x1000000) == 0) {
      windowState((QWidget *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
      QFlags<Qt::WindowState>::operator&
                ((QFlags<Qt::WindowState> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                 (int)((ulong)in_RDI >> 0x20));
      QFlags<Qt::WindowState>::operator|
                ((QFlags<Qt::WindowState> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
                 (WindowState)((ulong)in_RDI >> 0x20));
      setWindowState(unaff_retaddr,in_stack_00000024);
    }
    (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::showMinimized()
{
    bool isMin = isMinimized();
    if (isMin && isVisible())
        return;

    ensurePolished();

    if (!isMin)
        setWindowState((windowState() & ~Qt::WindowActive) | Qt::WindowMinimized);
    setVisible(true);
}